

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

void __thiscall GdlLookupExpression::GlyphAttrCheck(GdlLookupExpression *this,Symbol param_1)

{
  bool bVar1;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtGlyphData);
  if (!bVar1) {
    bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtSlotAttr);
    if (bVar1) {
      paVar3 = &local_38.field_2;
      local_38._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,
                 "Slot attribute references are not permitted in glyph attribute values","");
      GrcErrorList::AddError
                (&g_errorList,0x83c,&(this->super_GdlExpression).super_GdlObject,&local_38);
      _Var2._M_p = local_38._M_dataplus._M_p;
    }
    else {
      bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtFeature);
      if (bVar1) {
        paVar3 = &local_58.field_2;
        local_58._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "Feature references are not permitted in glyph attribute values","");
        GrcErrorList::AddError
                  (&g_errorList,0x83d,&(this->super_GdlExpression).super_GdlObject,&local_58);
        _Var2._M_p = local_58._M_dataplus._M_p;
      }
      else {
        bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtProcState);
        if (bVar1) {
          paVar3 = &local_78.field_2;
          local_78._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "Processing-state references are not permitted in glyph attribute values","");
          GrcErrorList::AddError
                    (&g_errorList,0x83e,&(this->super_GdlExpression).super_GdlObject,&local_78);
          _Var2._M_p = local_78._M_dataplus._M_p;
        }
        else {
          paVar3 = &local_98.field_2;
          local_98._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"Unknown attribute: ","");
          GrcSymbolTableEntry::FullName_abi_cxx11_(&local_b8,this->m_psymName);
          GrcErrorList::AddItem
                    (&g_errorList,true,0x83f,&(this->super_GdlExpression).super_GdlObject,
                     (GrpLineAndFile *)0x0,&local_98,&local_b8,(string *)0x0,(string *)0x0,
                     (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0);
          _Var2._M_p = local_98._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            _Var2._M_p = local_98._M_dataplus._M_p;
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p != paVar3) {
      operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GdlLookupExpression::GlyphAttrCheck(Symbol /*psymAttr*/)
{
	if (m_psymName->FitsSymbolType(ksymtGlyphData))
	{
		//	okay
	}
	else if (m_psymName->FitsSymbolType(ksymtSlotAttr))
	{
		g_errorList.AddError(2108, this,
			"Slot attribute references are not permitted in glyph attribute values");
	}
	else if (m_psymName->FitsSymbolType(ksymtFeature))
	{
		g_errorList.AddError(2109, this,
			"Feature references are not permitted in glyph attribute values");
	}
	else if (m_psymName->FitsSymbolType(ksymtProcState))
	{
		g_errorList.AddError(2110, this,
			"Processing-state references are not permitted in glyph attribute values");
	}
	else
	{
		g_errorList.AddError(2111, this,
			"Unknown attribute: ",
			m_psymName->FullName());
	}
}